

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeSSBOBlockTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::ssbo_block_matching
               (NegativeTestContext *ctx)

{
  MessageBuilder *this;
  ostringstream *poVar1;
  bool bVar2;
  ContextType ctxType;
  GLuint shader;
  GLuint program;
  GLuint shader_00;
  char *__s;
  long lVar3;
  SsboArgs *in_RCX;
  SsboArgs *args;
  TestLog *in_R8;
  TestLog *log;
  allocator<char> local_5d8;
  allocator<char> local_5d7;
  allocator<char> local_5d6;
  allocator<char> local_5d5;
  allocator<char> local_5d4;
  allocator<char> local_5d3;
  allocator<char> local_5d2;
  allocator<char> local_5d1;
  TestLog *local_5d0;
  ArgMember local_5c8 [8];
  string shaderFragmentString;
  SsboArgData *local_588;
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  argDataVectorFrag;
  char *shaderVertexCharPtr;
  GLint linkStatus;
  string message;
  string local_510;
  char *shaderFragmentCharPtr;
  string shaderVertexString;
  string local_4b0;
  string local_490;
  string local_470;
  string versionString;
  undefined1 local_430 [40];
  SsboArgData argDataArrayFrag [8];
  undefined1 local_2c8 [8];
  MessageBuilder local_2c0;
  SsboArgs ssboArgs;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*ctx->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  local_5d0 = (ctx->super_CallLogWrapper).m_log;
  message._M_dataplus._M_p = (pointer)&message.field_2;
  message._M_string_length = 0;
  message.field_2._M_local_buf[0] = '\0';
  __s = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&versionString,__s,(allocator<char> *)(local_2c8 + 8));
  std::__cxx11::string::string((string *)&local_470,(string *)&versionString);
  anon_unknown_0::args::SsboArgs::SsboArgs(&ssboArgs,&local_470,local_5d0);
  std::__cxx11::string::~string((string *)&local_470);
  shaderVertexString._M_dataplus._M_p = (pointer)&shaderVertexString.field_2;
  shaderVertexString._M_string_length = 0;
  shaderVertexString.field_2._M_local_buf[0] = '\0';
  local_5c8[7] = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)(local_2c8 + 8),"std140",&local_5d1);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayFrag,local_5c8 + 7,(string *)(local_2c8 + 8));
  local_5c8[6] = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderFragmentString,"10",&local_5d2);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayFrag + 1,local_5c8 + 6,&shaderFragmentString);
  local_5c8[5] = 2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&argDataVectorFrag,"row_major",&local_5d3);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayFrag + 2,local_5c8 + 5,(string *)&argDataVectorFrag);
  local_5c8[4] = 3;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderFragmentCharPtr,"vec2",&local_5d4);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayFrag + 3,local_5c8 + 4,(string *)&shaderFragmentCharPtr);
  local_5c8[3] = 4;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&linkStatus,"name_changed",&local_5d5);
  anon_unknown_0::args::SsboArgData::SsboArgData
            (argDataArrayFrag + 4,local_5c8 + 3,(string *)&linkStatus);
  local_5c8[2] = 5;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_510,"20",&local_5d6);
  anon_unknown_0::args::SsboArgData::SsboArgData(argDataArrayFrag + 5,local_5c8 + 2,&local_510);
  local_5c8[1] = 6;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"5",&local_5d7);
  anon_unknown_0::args::SsboArgData::SsboArgData(argDataArrayFrag + 6,local_5c8 + 1,&local_490);
  local_5c8[0] = ARGMEMBER_REORDER;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b0,"true",&local_5d8);
  anon_unknown_0::args::SsboArgData::SsboArgData(argDataArrayFrag + 7,local_5c8,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&linkStatus);
  std::__cxx11::string::~string((string *)&shaderFragmentCharPtr);
  std::__cxx11::string::~string((string *)&argDataVectorFrag);
  std::__cxx11::string::~string((string *)&shaderFragmentString);
  std::__cxx11::string::~string((string *)(local_2c8 + 8));
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
  ::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData_const*,void>
            ((vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>>
              *)&argDataVectorFrag,argDataArrayFrag,(SsboArgData *)local_2c8,
             (allocator_type *)in_RCX);
  (anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
            ((string *)(local_2c8 + 8),(_anonymous_namespace_ *)0x8b31,(GLenum)&ssboArgs,in_RCX,
             in_R8);
  std::__cxx11::string::operator=((string *)&shaderVertexString,(string *)(local_2c8 + 8));
  std::__cxx11::string::~string((string *)(local_2c8 + 8));
  shaderVertexCharPtr = shaderVertexString._M_dataplus._M_p;
  shader = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b31);
  std::__cxx11::string::_M_assign((string *)&message);
  poVar1 = &local_2c0.m_str;
  local_2c0.m_log = local_5d0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,(string *)&message);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)(local_2c8 + 8),(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  log = (TestLog *)0x0;
  glu::CallLogWrapper::glShaderSource
            (&ctx->super_CallLogWrapper,shader,1,&shaderVertexCharPtr,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader);
  local_588 = argDataVectorFrag.
              super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
              ._M_impl.super__Vector_impl_data._M_start;
  args = (SsboArgs *)0x28;
  lVar3 = ((long)argDataVectorFrag.
                 super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)argDataVectorFrag.
                super__Vector_base<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x28;
  poVar1 = &local_2c0.m_str;
  this = (MessageBuilder *)(local_2c8 + 8);
  while (bVar2 = lVar3 != 0, lVar3 = lVar3 + -1, bVar2) {
    linkStatus = -1;
    shaderFragmentString._M_dataplus._M_p = (pointer)&shaderFragmentString.field_2;
    shaderFragmentString._M_string_length = 0;
    shaderFragmentString.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)this,
               "Multiple shaders created using SSBO\'s sharing the same name but not matching layouts"
               ,(allocator<char> *)&local_510);
    NegativeTestContext::beginSection(ctx,(string *)this);
    std::__cxx11::string::~string((string *)this);
    program = glu::CallLogWrapper::glCreateProgram(&ctx->super_CallLogWrapper);
    anon_unknown_0::args::SsboArgs::setDefaultValues(&ssboArgs);
    anon_unknown_0::args::SsboArgData::SsboArgData((SsboArgData *)local_430,local_588);
    anon_unknown_0::args::SsboArgs::setSingleValue(&ssboArgs,(SsboArgData *)local_430);
    std::__cxx11::string::~string((string *)(local_430 + 8));
    (anonymous_namespace)::generateVaryingSSBOShader_abi_cxx11_
              ((string *)this,(_anonymous_namespace_ *)0x8b30,(GLenum)&ssboArgs,args,log);
    std::__cxx11::string::operator=((string *)&shaderFragmentString,(string *)this);
    std::__cxx11::string::~string((string *)this);
    shaderFragmentCharPtr = shaderFragmentString._M_dataplus._M_p;
    shader_00 = glu::CallLogWrapper::glCreateShader(&ctx->super_CallLogWrapper,0x8b30);
    std::__cxx11::string::_M_assign((string *)&message);
    local_2c0.m_log = local_5d0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,(string *)&message);
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    log = (TestLog *)0x0;
    glu::CallLogWrapper::glShaderSource
              (&ctx->super_CallLogWrapper,shader_00,1,&shaderFragmentCharPtr,(GLint *)0x0);
    glu::CallLogWrapper::glCompileShader(&ctx->super_CallLogWrapper,shader_00);
    glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader);
    glu::CallLogWrapper::glAttachShader(&ctx->super_CallLogWrapper,program,shader_00);
    glu::CallLogWrapper::glLinkProgram(&ctx->super_CallLogWrapper,program);
    args = (SsboArgs *)&linkStatus;
    glu::CallLogWrapper::glGetProgramiv(&ctx->super_CallLogWrapper,program,0x8b82,(GLint *)args);
    logProgramInfo(ctx,program);
    if (linkStatus == 1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)this,"Program should not have linked",(allocator<char> *)&local_510);
      NegativeTestContext::fail(ctx,(string *)this);
      std::__cxx11::string::~string((string *)this);
    }
    glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader_00);
    glu::CallLogWrapper::glDeleteProgram(&ctx->super_CallLogWrapper,program);
    NegativeTestContext::endSection(ctx);
    std::__cxx11::string::~string((string *)&shaderFragmentString);
    local_588 = local_588 + 1;
  }
  glu::CallLogWrapper::glDeleteShader(&ctx->super_CallLogWrapper,shader);
  std::
  vector<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData,_std::allocator<deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::args::SsboArgData>_>
  ::~vector(&argDataVectorFrag);
  lVar3 = 0x120;
  do {
    std::__cxx11::string::~string((string *)((long)&argDataArrayFrag[0].member + lVar3));
    lVar3 = lVar3 + -0x28;
  } while (lVar3 != -0x20);
  std::__cxx11::string::~string((string *)&shaderVertexString);
  anon_unknown_0::args::SsboArgs::~SsboArgs(&ssboArgs);
  std::__cxx11::string::~string((string *)&versionString);
  std::__cxx11::string::~string((string *)&message);
  return;
}

Assistant:

void ssbo_block_matching(NegativeTestContext& ctx)
{
	const bool				isES32													=	contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	version													=	isES32 ? glu::GLSL_VERSION_320_ES : glu::GLSL_VERSION_310_ES;
	tcu::TestLog&			log														=	ctx.getLog();
	std::string				message;
	std::string				versionString(glu::getGLSLVersionDeclaration(version));
	args::SsboArgs			ssboArgs(versionString, log);
	GLint					shaderVertexGL;
	std::string				shaderVertexString;
	const char*				shaderVertexCharPtr;

	// List of arguments used to create varying ssbo objects in the fragment shader
	const args::SsboArgData argDataArrayFrag[] = {	args::SsboArgData(args::ARGMEMBER_FORMAT,			"std140"),
													args::SsboArgData(args::ARGMEMBER_BINDING_POINT,	"10"),
													args::SsboArgData(args::ARGMEMBER_MATRIX_ORDER,		"row_major"),
													args::SsboArgData(args::ARGMEMBER_MEMBER_TYPE,		"vec2"),
													args::SsboArgData(args::ARGMEMBER_NAME,				"name_changed"),
													args::SsboArgData(args::ARGMEMBER_FIXED_ARRAY,		"20"),
													args::SsboArgData(args::ARGMEMBER_VARIABLE_ARRAY,	"5"),
													args::SsboArgData(args::ARGMEMBER_REORDER,			"true") };
	std::vector<args::SsboArgData> argDataVectorFrag(argDataArrayFrag, argDataArrayFrag + sizeof(argDataArrayFrag) / sizeof(argDataArrayFrag[0]));

	// create default vertex shader
	shaderVertexString = generateVaryingSSBOShader(GL_VERTEX_SHADER, ssboArgs, log);
	shaderVertexCharPtr = shaderVertexString.c_str();
	shaderVertexGL = ctx.glCreateShader(GL_VERTEX_SHADER);

	// log
	message = shaderVertexString;
	log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

	// compile
	ctx.glShaderSource(shaderVertexGL, 1, &shaderVertexCharPtr, DE_NULL);
	ctx.glCompileShader(shaderVertexGL);

	for (std::size_t idx = 0; idx < argDataVectorFrag.size(); ++idx)
	{
		GLint			linkStatus				=	-1;
		GLint			program;
		GLint			shaderFragmentGL;
		std::string		shaderFragmentString;
		const char*		shaderFragmentCharPtr;

		ctx.beginSection("Multiple shaders created using SSBO's sharing the same name but not matching layouts");

		program = ctx.glCreateProgram();

		// reset args to default and make a single change
		ssboArgs.resetValues();
		ssboArgs.setSingleValue(argDataVectorFrag[idx]);

		// create fragment shader
		shaderFragmentString = generateVaryingSSBOShader(GL_FRAGMENT_SHADER, ssboArgs, log);
		shaderFragmentCharPtr = shaderFragmentString.c_str();
		shaderFragmentGL = ctx.glCreateShader(GL_FRAGMENT_SHADER);

		// log
		message = shaderFragmentString;
		log << tcu::TestLog::Message << message << tcu::TestLog::EndMessage;

		// compile
		ctx.glShaderSource(shaderFragmentGL, 1, &shaderFragmentCharPtr, DE_NULL);
		ctx.glCompileShader(shaderFragmentGL);

		// attach shaders to program and attempt to link
		ctx.glAttachShader(program, shaderVertexGL);
		ctx.glAttachShader(program, shaderFragmentGL);
		ctx.glLinkProgram(program);
		ctx.glGetProgramiv(program, GL_LINK_STATUS, &linkStatus);

		logProgramInfo(ctx, program);

		if (linkStatus == GL_TRUE)
		{
			ctx.fail("Program should not have linked");
		}

		// clean up resources
		ctx.glDeleteShader(shaderFragmentGL);
		ctx.glDeleteProgram(program);

		ctx.endSection();
	}

	// clean up default resources
	ctx.glDeleteShader(shaderVertexGL);
}